

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,endpoint *ep,span<const_char> buf)

{
  session_logger *psVar1;
  span<const_char> buf_00;
  bool bVar2;
  uint uVar3;
  index_type iVar4;
  undefined8 uVar5;
  ulong uVar6;
  pointer ppVar7;
  element_type *this_00;
  endpoint *ep_00;
  endpoint *ep_01;
  undefined1 local_b8 [8];
  shared_ptr<libtorrent::aux::udp_tracker_connection> p;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
  local_88;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
  local_80;
  iterator i;
  uint32_t transaction;
  uint32_t action;
  span<const_char> ptr;
  string local_50;
  aux *local_30;
  endpoint *ep_local;
  tracker_manager *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (tracker_manager *)buf.m_ptr;
  local_30 = (aux *)ep;
  ep_local = (endpoint *)this;
  iVar4 = span<const_char>::size((span<const_char> *)&this_local);
  if (iVar4 < 8) {
    uVar3 = (**this->m_ses->_vptr_session_logger)();
    if ((uVar3 & 1) != 0) {
      psVar1 = this->m_ses;
      print_endpoint_abi_cxx11_(&local_50,local_30,ep_00);
      uVar5 = ::std::__cxx11::string::c_str();
      uVar6 = span<const_char>::size((span<const_char> *)&this_local);
      (*psVar1->_vptr_session_logger[1])
                (psVar1,"incoming packet from %s, not a UDP tracker message (%d Bytes)",uVar5,
                 uVar6 & 0xffffffff);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    buf_local.m_len._7_1_ = 0;
  }
  else {
    _transaction = this_local;
    ptr.m_ptr = buf_local.m_ptr;
    i.
    super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
    ._M_cur._4_4_ = read_uint32<char_const>((span<const_char> *)&transaction);
    if (i.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
        ._M_cur._4_4_ < 4) {
      i.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
      ._M_cur._0_4_ = read_uint32<char_const>((span<const_char> *)&transaction);
      local_80._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>_>
           ::find(&this->m_udp_conns,(key_type *)&i);
      local_88._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>_>
           ::end(&this->m_udp_conns);
      bVar2 = ::std::__detail::operator==(&local_80,&local_88);
      if (bVar2) {
        uVar3 = (**this->m_ses->_vptr_session_logger)();
        if ((uVar3 & 1) != 0) {
          psVar1 = this->m_ses;
          print_endpoint_abi_cxx11_
                    ((string *)
                     &p.
                      super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,local_30,ep_01);
          uVar5 = ::std::__cxx11::string::c_str();
          (*psVar1->_vptr_session_logger[1])
                    (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                     uVar5,(ulong)(uint32_t)
                                  i.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                                  ._M_cur);
          ::std::__cxx11::string::~string
                    ((string *)
                     &p.
                      super___shared_ptr<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        buf_local.m_len._7_1_ = 0;
      }
      else {
        ppVar7 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false,_false>
                               *)&local_80);
        ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::shared_ptr
                  ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_b8,&ppVar7->second);
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_b8);
        buf_00.m_len = (difference_type)buf_local.m_ptr;
        buf_00.m_ptr = (char *)this_local;
        buf_local.m_len._7_1_ =
             udp_tracker_connection::on_receive(this_00,(endpoint *)local_30,buf_00);
        ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_b8);
      }
    }
    else {
      buf_local.m_len._7_1_ = 0;
    }
  }
  return (bool)(buf_local.m_len._7_1_ & 1);
}

Assistant:

bool tracker_manager::incoming_packet(udp::endpoint const& ep
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 8)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming packet from %s, not a UDP tracker message "
					"(%d Bytes)", print_endpoint(ep).c_str(), int(buf.size()));
			}
#endif
			return false;
		}

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming UDP tracker packet from %s has invalid "
					"transaction ID (%x)", print_endpoint(ep).c_str()
					, transaction);
			}
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive(ep, buf);
	}